

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.h
# Opt level: O0

ostream * Fixpp::Type::operator<<(ostream *os,Time *value)

{
  bool bVar1;
  tm *__tp;
  uint *puVar2;
  _Optional_payload_base<int> local_68;
  _Optional_payload_base<int> local_60;
  _Optional_payload_base<int> local_58;
  _Optional_payload_base<int> local_50;
  char local_48 [8];
  char buffer [32];
  time_t local_20;
  time_t time;
  Time *value_local;
  ostream *os_local;
  
  time = (time_t)value;
  value_local = (Time *)os;
  local_20 = UTCTimestamp::Time::time(value,&value->m_time);
  __tp = gmtime(&local_20);
  strftime(local_48,0x20,"%Y%m%d-%H:%M:%S",__tp);
  std::operator<<((ostream *)value_local,local_48);
  local_50 = (_Optional_payload_base<int>)UTCTimestamp::Time::msec((Time *)time);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_50);
  if (bVar1) {
    local_58 = (_Optional_payload_base<int>)UTCTimestamp::Time::msec((Time *)time);
    puVar2 = (uint *)std::optional<int>::value((optional<int> *)&local_58);
    sprintf(local_48,".%03d",(ulong)*puVar2);
    std::operator<<((ostream *)value_local,local_48);
    local_60 = (_Optional_payload_base<int>)UTCTimestamp::Time::usec((Time *)time);
    bVar1 = std::optional::operator_cast_to_bool((optional *)&local_60);
    if (bVar1) {
      local_68 = (_Optional_payload_base<int>)UTCTimestamp::Time::usec((Time *)time);
      puVar2 = (uint *)std::optional<int>::value((optional<int> *)&local_68);
      sprintf(local_48,"%03d",(ulong)*puVar2);
      std::operator<<((ostream *)value_local,local_48);
    }
  }
  return (ostream *)value_local;
}

Assistant:

inline std::ostream& operator<<(std::ostream& os, const UTCTimestamp::Time& value)
        {
            auto time = value.time();
            char buffer[32];
            strftime(buffer, sizeof buffer, "%Y%m%d-%H:%M:%S", std::gmtime(&time));
            os << buffer;
            if (value.msec())
            {
                sprintf(buffer, ".%03d", value.msec().value());
                os << buffer;
                if (value.usec())
                {
                    sprintf(buffer, "%03d", value.usec().value());
                    os << buffer;
                }
            }
            return os;
        }